

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

bool Js::JavascriptOperators::ShouldTryDeleteProperty
               (RecyclableObject *instance,JavascriptString *propertyNameString,
               PropertyRecord **pPropertyRecord)

{
  bool bVar1;
  ScriptContext *pSVar2;
  IRecyclerVisitedObject local_30;
  PropertyRecord *propertyRecord;
  PropertyRecord **pPropertyRecord_local;
  JavascriptString *propertyNameString_local;
  RecyclableObject *instance_local;
  
  local_30._vptr_IRecyclerVisitedObject = (_func_int **)0x0;
  propertyRecord = (PropertyRecord *)pPropertyRecord;
  pPropertyRecord_local = (PropertyRecord **)propertyNameString;
  propertyNameString_local = (JavascriptString *)instance;
  bVar1 = CanShortcutOnUnknownPropertyName(instance);
  if (bVar1) {
    pSVar2 = RecyclableObject::GetScriptContext(&propertyNameString_local->super_RecyclableObject);
    ScriptContext::FindPropertyRecord
              (pSVar2,(JavascriptString *)pPropertyRecord_local,(PropertyRecord **)&local_30);
  }
  else {
    pSVar2 = RecyclableObject::GetScriptContext(&propertyNameString_local->super_RecyclableObject);
    ScriptContext::GetOrAddPropertyRecord
              (pSVar2,(JavascriptString *)pPropertyRecord_local,(PropertyRecord **)&local_30);
  }
  if (local_30._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
    (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject = local_30._vptr_IRecyclerVisitedObject;
  }
  return local_30._vptr_IRecyclerVisitedObject != (_func_int **)0x0;
}

Assistant:

bool JavascriptOperators::ShouldTryDeleteProperty(RecyclableObject* instance, JavascriptString *propertyNameString, PropertyRecord const **pPropertyRecord)
    {
        PropertyRecord const *propertyRecord = nullptr;
        if (!JavascriptOperators::CanShortcutOnUnknownPropertyName(instance))
        {
            instance->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        }
        else
        {
            instance->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);
        }

        if (propertyRecord == nullptr)
        {
            return false;
        }
        *pPropertyRecord = propertyRecord;
        return true;
    }